

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O2

string * __thiscall
czh::utils::dtoa_abi_cxx11_(string *__return_storage_ptr__,utils *this,double *value)

{
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  dVar1 = *(double *)this;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    fill_double_abi_cxx11_(&local_40,this,ABS(dVar1));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    if ((long)dVar1 < 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"-0.0",(allocator<char> *)&local_60);
      return __return_storage_ptr__;
    }
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&local_60,"0.0");
  }
  if (0.0 < *(double *)this || *(double *)this == 0.0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_60.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_60._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,local_60.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_60._M_string_length;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    std::operator+(__return_storage_ptr__,"-",&local_60);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string dtoa(const double &value)
  {
    if (value == 0 && ((double_to_uint64(value) & SIGN_MASK) != 0))
    {
      return "-0.0";
    }
    std::string buffer;
    if (value == 0)
    {
      buffer = "0.0";
    }
    else
    {
      buffer = fill_double(std::abs(value));
    }
    if (value < 0)
    {
      return "-" + buffer;
    }
    return std::move(buffer);
  }